

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynModuleImport * ParseImport(ParseContext *ctx)

{
  Lexeme *start;
  IntrusiveList<SynIdentifier> parts;
  IntrusiveList<SynIdentifier> path_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  undefined4 extraout_var_00;
  ByteCode *bCode;
  undefined4 extraout_var_01;
  InplaceStr IVar5;
  IntrusiveList<SynIdentifier> path;
  
  start = ctx->currentLexeme;
  if (start->type == lex_import) {
    ctx->currentLexeme = start + 1;
    path.head = (SynIdentifier *)0x0;
    path.tail = (SynIdentifier *)0x0;
    bVar1 = anon_unknown.dwarf_153727::CheckAt(ctx,lex_string,"ERROR: name expected after import");
    if (bVar1) {
      IVar5 = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar3 = ParseContext::Previous(ctx);
      pLVar4 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var,iVar2),pLVar3,pLVar4,IVar5);
      IntrusiveList<SynIdentifier>::push_back(&path,(SynIdentifier *)CONCAT44(extraout_var,iVar2));
    }
    while (ctx->currentLexeme->type == lex_point) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      bVar1 = anon_unknown.dwarf_153727::CheckAt(ctx,lex_string,"ERROR: name expected after \'.\'");
      if (bVar1) {
        IVar5 = ParseContext::Consume(ctx);
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pLVar3 = ParseContext::Previous(ctx);
        pLVar4 = ParseContext::Previous(ctx);
        SynIdentifier::SynIdentifier
                  ((SynIdentifier *)CONCAT44(extraout_var_00,iVar2),pLVar3,pLVar4,IVar5);
        IntrusiveList<SynIdentifier>::push_back
                  (&path,(SynIdentifier *)CONCAT44(extraout_var_00,iVar2));
      }
    }
    anon_unknown.dwarf_153727::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after import expression");
    parts.tail = path.tail;
    parts.head = path.head;
    bCode = (ByteCode *)GetBytecodeFromPath(ctx,start,parts);
    if (bCode != (ByteCode *)0x0) {
      ImportModuleNamespaces(ctx,start,bCode);
      SmallArray<InplaceStr,_8U>::pop_back(&ctx->activeImports);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      pLVar3 = ParseContext::Previous(ctx);
      path_00.tail = path.tail;
      path_00.head = path.head;
      SynModuleImport::SynModuleImport
                ((SynModuleImport *)CONCAT44(extraout_var_01,iVar2),start,pLVar3,path_00,bCode);
      return (SynModuleImport *)CONCAT44(extraout_var_01,iVar2);
    }
  }
  return (SynModuleImport *)0x0;
}

Assistant:

SynModuleImport* ParseImport(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_import))
	{
		IntrusiveList<SynIdentifier> path;

		if(CheckAt(ctx, lex_string, "ERROR: name expected after import"))
		{
			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		while(ctx.Consume(lex_point))
		{
			if(CheckAt(ctx, lex_string, "ERROR: name expected after '.'"))
			{
				InplaceStr value = ctx.Consume();
				path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
			}
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after import expression");

		if(const char *binary = GetBytecodeFromPath(ctx, start, path))
		{
			ImportModuleNamespaces(ctx, start, (ByteCode*)binary);

			ctx.activeImports.pop_back();

			return new (ctx.get<SynModuleImport>()) SynModuleImport(start, ctx.Previous(), path, (ByteCode*)binary);
		}
	}

	return NULL;
}